

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-file.c
# Opt level: O2

_Bool my_dread(ang_dir *dir,char *fname,size_t len)

{
  int iVar1;
  dirent *pdVar2;
  stat filedata;
  char path [1024];
  stat local_4c8;
  char local_438 [1032];
  
  if (dir == (ang_dir *)0x0) {
    __assert_fail("dir != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-file.c"
                  ,0x5da,"_Bool my_dread(ang_dir *, char *, size_t)");
  }
  do {
    pdVar2 = readdir((DIR *)dir->d);
    if (pdVar2 == (dirent *)0x0) goto LAB_0020111f;
    path_build(local_438,0x400,dir->dirname,pdVar2->d_name);
    iVar1 = stat(local_438,&local_4c8);
  } while ((iVar1 != 0) || ((dir->only_files == true && ((local_4c8.st_mode & 0xf000) == 0x4000))));
  my_strcpy(fname,pdVar2->d_name,len);
LAB_0020111f:
  return pdVar2 != (dirent *)0x0;
}

Assistant:

bool my_dread(ang_dir *dir, char *fname, size_t len)
{
	struct dirent *entry;
	struct stat filedata;
	char path[1024];

	assert(dir != NULL);

	/* Try reading another entry */
	while (1) {
		entry = readdir(dir->d);
		if (!entry) return false;

		path_build(path, sizeof path, dir->dirname, entry->d_name);
            
		/* Check to see if it exists */
		if (stat(path, &filedata) != 0)
			continue;

		/* Check to see if it's a directory */
		if (dir->only_files && S_ISDIR(filedata.st_mode))
			continue;

		/* We've found something worth returning */
		break;
	}

	/* Copy the filename */
	my_strcpy(fname, entry->d_name, len);

	return true;
}